

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_callscrn.c
# Opt level: O0

int main(int argc,char **argv)

{
  void *__ptr;
  FILE *__stream;
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  byte *local_88;
  call_screen_list_entry_t *pcallscreen_entry;
  uint8_t *load_buffer;
  dlog_mt_call_screen_universal_t *pcallscrnu_table;
  dlog_mt_call_screen_list_t *pcallscrn_table;
  int ret;
  size_t size;
  int phone_num_len;
  int callscrn_max_entries;
  size_t i;
  char phone_number_str [20];
  int local_2c;
  FILE *pFStack_28;
  int callscrn_index;
  FILE *ostream;
  FILE *instream;
  char **argv_local;
  int argc_local;
  
  pFStack_28 = (FILE *)0x0;
  memset(&i,0,0x14);
  pcallscrn_table._4_4_ = 0;
  if (argc < 2) {
    printf(
          "Usage:\n\tmm_callscrn mm_table_18.bin [outputfile.bin]\n\tmm_callscrn mm_table_3b.bin [outputfile.bin]\n\tmm_callscrn mm_table_5c.bin [outputfile.bin]\n"
          );
    argv_local._4_4_ = -1;
  }
  else {
    printf("Nortel Millennium Call Screening List Table 24, 59, 92 (0x18, 0x3b, 0x5c) Dump\n\n");
    __ptr = calloc(1,0xd49);
    if (__ptr == (void *)0x0) {
      printf("Failed to allocate %zu bytes.\n",0xbf5);
      argv_local._4_4_ = -0xc;
    }
    else {
      __stream = fopen(argv[1],"rb");
      if (__stream == (FILE *)0x0) {
        printf("Error opening %s\n",argv[1]);
        free(__ptr);
        argv_local._4_4_ = -2;
      }
      else {
        fseek(__stream,0,2);
        sVar1 = ftell(__stream);
        fseek(__stream,0,0);
        if (sVar1 == 0x2d0) {
          printf("Call Screen Universal (60-entry) table.\n");
          size._4_4_ = 0x3c;
          size._0_4_ = 8;
        }
        else if (sVar1 == 0x3fc) {
          printf("Call Screen Enhanced (85-entry) table.\n");
          size._4_4_ = 0x55;
          size._0_4_ = 8;
        }
        else if (sVar1 == 0xbf4) {
          printf("Call Screening List (180-entry) table.\n");
          size._4_4_ = 0xb4;
          size._0_4_ = 9;
        }
        else {
          if (sVar1 != 0xd48) {
            printf("Invalid Call Screening table, len=%zu.\n",sVar1);
            free(__ptr);
            fclose(__stream);
            return -5;
          }
          printf("Call Screening List (200-entry) table.\n");
          size._4_4_ = 200;
          size._0_4_ = 9;
        }
        sVar2 = fread((void *)((long)__ptr + 1),sVar1,1,__stream);
        if (sVar2 == 1) {
          fclose(__stream);
          printf(
                "+-------------------------------------------------------------------------------------------+\n| Call Entry | FCF  |CALLTYP|Carrier|Flags2| Phone Number       | Class | Class Description |\n+------------+------+-------+-------+------+--------------------+-------+-------------------+\n"
                );
          for (local_2c = 0; local_2c < size._4_4_; local_2c = local_2c + 1) {
            if ((sVar1 == 0xbf4) || (sVar1 == 0xd48)) {
              lVar4 = (long)local_2c * 0x11;
            }
            else {
              lVar4 = (long)local_2c * 0xc;
            }
            local_88 = (byte *)((long)__ptr + lVar4 + 1);
            if (local_88[4] != 0) {
              pcVar3 = callscrn_num_to_string((char *)&i,0x14,local_88 + 4,(long)(int)size);
              i._0_1_ = *pcVar3;
              printf("| %3d (0x%02x) | 0x%02x |%s|  0x%02x | 0x%02x | %18s |  0x%02x | ",
                     (ulong)(local_2c + 1),(ulong)(local_2c + 1),(ulong)*local_88,
                     call_type_strings[(int)(local_88[1] & 0xf)],(ulong)local_88[2],
                     (uint)local_88[3],&i,(uint)local_88[0xd]);
              for (_phone_num_len = 0; _phone_num_len < 5; _phone_num_len = _phone_num_len + 1) {
                if (local_88[0xd] == call_class_lut[_phone_num_len]) {
                  printf("%s | ",str_call_class[_phone_num_len]);
                  break;
                }
              }
              print_bits(*local_88,callscrn_free_flags_str);
              print_bits(local_88[3],callscrn_ident2_str);
              printf("\n");
            }
          }
          printf(
                "+-------------------------------------------------------------------------------------------+\n"
                );
          if ((argc < 3) || (pFStack_28 = fopen(argv[2],"wb"), pFStack_28 != (FILE *)0x0)) {
            if (pFStack_28 != (FILE *)0x0) {
              printf("\nWriting new table to %s (%zu bytes)\n",argv[2],sVar1);
              sVar1 = fwrite((void *)((long)__ptr + 1),sVar1,1,pFStack_28);
              if (sVar1 != 1) {
                printf("Error writing output file %s\n",argv[2]);
                pcallscrn_table._4_4_ = -5;
              }
              fclose(pFStack_28);
            }
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
            argv_local._4_4_ = pcallscrn_table._4_4_;
          }
          else {
            printf("Error opening output file %s for write.\n",argv[2]);
            argv_local._4_4_ = -2;
          }
        }
        else {
          printf("Error reading CALLSCRN table.\n");
          free(__ptr);
          fclose(__stream);
          argv_local._4_4_ = -5;
        }
      }
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) {
    FILE  *instream;
    FILE  *ostream = NULL;
    int    callscrn_index;
    char   phone_number_str[20] = { 0 };
    size_t i;
    int    callscrn_max_entries = 0;
    int    phone_num_len = 0;
    size_t size;
    int    ret = 0;

    dlog_mt_call_screen_list_t *pcallscrn_table;
    dlog_mt_call_screen_universal_t* pcallscrnu_table;
    uint8_t* load_buffer;

    if (argc <= 1) {
        printf("Usage:\n" \
               "\tmm_callscrn mm_table_18.bin [outputfile.bin]\n"
               "\tmm_callscrn mm_table_3b.bin [outputfile.bin]\n"
               "\tmm_callscrn mm_table_5c.bin [outputfile.bin]\n");
        return -1;
    }

    printf("Nortel Millennium Call Screening List Table 24, 59, 92 (0x18, 0x3b, 0x5c) Dump\n\n");

    pcallscrn_table = (dlog_mt_call_screen_list_t *)calloc(1, CALLSCRN_TABLE_LEN_MTR19);
    pcallscrnu_table = (dlog_mt_call_screen_universal_t *)pcallscrn_table;

    if (pcallscrn_table == NULL) {
        printf("Failed to allocate %zu bytes.\n", sizeof(dlog_mt_call_screen_list_t));
        return -ENOMEM;
    }

    if ((instream = fopen(argv[1], "rb")) == NULL) {
        printf("Error opening %s\n", argv[1]);
        free(pcallscrn_table);
        return -ENOENT;
    }

    fseek(instream, 0, SEEK_END);
    size = ftell(instream);
    fseek(instream, 0, SEEK_SET);

    switch (size + 1) {
    case CALLSCRNU_TABLE_LEN:
        printf("Call Screen Universal (60-entry) table.\n");
        callscrn_max_entries = CALLSCRNU_TABLE_MAX;
        phone_num_len = 8;
        break;
    case CALLSCRNE_TABLE_LEN:
        printf("Call Screen Enhanced (85-entry) table.\n");
        callscrn_max_entries = CALLSCRNE_TABLE_MAX;
        phone_num_len = 8;
        break;
    case CALLSCRN_TABLE_LEN:
        printf("Call Screening List (180-entry) table.\n");
        callscrn_max_entries = CALLSCRN_TABLE_MAX;
        phone_num_len = 9;
        break;
    case CALLSCRN_TABLE_LEN_MTR19:
        printf("Call Screening List (200-entry) table.\n");
        callscrn_max_entries = 200;
        phone_num_len = 9;
        break;
    default:
        printf("Invalid Call Screening table, len=%zu.\n", size);
        free(pcallscrn_table);
        fclose(instream);
        return -EIO;
    }

    load_buffer = ((uint8_t*)pcallscrn_table) + 1;
    if (fread(load_buffer, size, 1, instream) != 1) {
        printf("Error reading CALLSCRN table.\n");
        free(pcallscrn_table);
        fclose(instream);
        return -EIO;
    }

    fclose(instream);

    printf("+-------------------------------------------------------------------------------------------+\n" \
           "| Call Entry | FCF  |CALLTYP|Carrier|Flags2| Phone Number       | Class | Class Description |\n" \
           "+------------+------+-------+-------+------+--------------------+-------+-------------------+\n");

    for (callscrn_index = 0; callscrn_index < callscrn_max_entries; callscrn_index++) {
        call_screen_list_entry_t *pcallscreen_entry;

        switch (size + 1) {
        case CALLSCRN_TABLE_LEN:        /* 180-entry table */
        case CALLSCRN_TABLE_LEN_MTR19:  /* 200-entry table */
            pcallscreen_entry = &pcallscrn_table->entry[callscrn_index];
            break;
        default:                        /* All other tables */
            pcallscreen_entry = (call_screen_list_entry_t *)&pcallscrnu_table->entry[callscrn_index];
            break;
        }

        if (pcallscreen_entry->phone_number[0] == 0) continue;

        *phone_number_str = *callscrn_num_to_string(phone_number_str, sizeof(phone_number_str),
                                                    pcallscreen_entry->phone_number, phone_num_len);

        printf("| %3d (0x%02x) | 0x%02x |%s|  0x%02x | 0x%02x | %18s |  0x%02x | ",
               callscrn_index + 1, callscrn_index + 1,
               pcallscreen_entry->free_call_flags,
               call_type_strings[(pcallscreen_entry->call_type) & 0x0F],
               pcallscreen_entry->carrier_ref,
               pcallscreen_entry->ident2,
               phone_number_str,
               pcallscreen_entry->cs_class);

        for (i = 0; i < sizeof(call_class_lut); i++) {
            if (pcallscreen_entry->cs_class == call_class_lut[i]) {
                printf("%s | ", str_call_class[i]);
                break;
            }
        }
        print_bits(pcallscreen_entry->free_call_flags, (char **)callscrn_free_flags_str);
        print_bits(pcallscreen_entry->ident2,          (char **)callscrn_ident2_str);
        printf("\n");
    }

    printf("+-------------------------------------------------------------------------------------------+\n");

    /* Modify CALLSCRN table */

    if (argc > 2) {
        if ((ostream = fopen(argv[2], "wb")) == NULL) {
            printf("Error opening output file %s for write.\n", argv[2]);
            return -ENOENT;
        }
    }

    /* If output file was specified, write it. */
    if (ostream != NULL) {
        printf("\nWriting new table to %s (%zu bytes)\n", argv[2], size);

        if (fwrite(load_buffer, size, 1, ostream) != 1) {
            printf("Error writing output file %s\n", argv[2]);
            ret = -EIO;
        }
        fclose(ostream);
    }

    if (pcallscrn_table != NULL) {
        free(pcallscrn_table);
    }

    return ret;
}